

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcoflow.c
# Opt level: O0

DLword gcmaptable(DLword arg)

{
  DLword *pDVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int maxtypenumber;
  LispPTR addr;
  int typnum;
  LispPTR cellcnt;
  dtd *ptr;
  htoverflow *cell;
  DLword arg_local;
  
  iVar2 = GetSmalldata(*MaxTypeNumber_word);
  for (ptr = (dtd *)HToverflow; uVar3 = *(uint *)ptr & 0xfffffff, uVar3 != 0;
      ptr = (dtd *)&ptr->dtd_size) {
    if (((*(ushort *)((ulong)(MDStypetbl + (uVar3 >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(uVar3,*(uint *)ptr >> 0x1c);
    }
    *(uint *)ptr = *(uint *)ptr & 0xf0000000;
    *(uint *)ptr = *(uint *)ptr & 0xfffffff;
  }
  for (maxtypenumber = 1; pDVar1 = DTDspace, maxtypenumber <= iVar2;
      maxtypenumber = maxtypenumber + 1) {
    lVar4 = (long)(maxtypenumber << 4);
    lVar5 = (long)(maxtypenumber << 1);
    uVar3 = (uint)DTDspace[lVar4 + lVar5 + 3];
    if (uVar3 != 0) {
      *(uint *)(DTDspace + lVar4 + lVar5 + 0xc) = uVar3 + *(int *)(DTDspace + lVar4 + lVar5 + 0xc);
      pDVar1[lVar4 + lVar5 + 3] = 0;
      if (*Reclaim_cnt_word != 0) {
        if (uVar3 < *Reclaim_cnt_word) {
          *Reclaim_cnt_word = *Reclaim_cnt_word - uVar3;
        }
        else {
          *Reclaim_cnt_word = 0;
          doreclaim();
        }
      }
    }
  }
  return arg;
}

Assistant:

DLword gcmaptable(DLword arg) {
  struct htoverflow *cell;
  struct dtd *ptr;
  LispPTR cellcnt;
  int typnum;
  LispPTR addr;
  int maxtypenumber = GetSmalldata(*MaxTypeNumber_word);

  cell = (struct htoverflow *)HToverflow;
  /* This proc. protected from interrupt */
  while ((addr = cell->ptr) != NIL) {
    REC_GCLOOKUP(addr, cell->pcase);
    cell->ptr = 0;
    cell->pcase = 0;
    ++cell; /* (\ADDBASE CELL WORDSPERCELL) */
  }
  for (typnum = 1; typnum <= maxtypenumber; ++typnum)
  /* applied alltype */
  {
    ptr = (struct dtd *)GetDTD(typnum);
    if ((cellcnt = ptr->dtd_cnt0) != 0) {
      ptr->dtd_oldcnt += cellcnt;
      ptr->dtd_cnt0 = 0;
      Increment_Allocation_Count(cellcnt);
    }
  }
  return (arg);
}